

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

void anon_unknown.dwarf_ac3::ndiTXHelper(ndicapi *pol,char *command,char *commandReply)

{
  bool bVar1;
  unsigned_long uVar2;
  int local_48;
  int local_44;
  int strayCount;
  int handleCount;
  int handle;
  int n;
  int j;
  int i;
  char *writePointer;
  unsigned_long mode;
  char *commandReply_local;
  char *command_local;
  ndicapi *pol_local;
  
  writePointer = (char *)0x1;
  if (((command[2] == ':') && (command[7] != '\r')) || ((command[2] == ' ' && (command[3] != '\r')))
     ) {
    writePointer = (char *)ndiHexToUnsignedLong(command + 3,4);
  }
  uVar2 = ndiHexToUnsignedLong(commandReply,2);
  local_44 = (int)uVar2;
  handle = 0;
  mode = (unsigned_long)commandReply;
  while( true ) {
    bVar1 = false;
    if (handle < 2) {
      bVar1 = '\x1f' < *(char *)mode;
    }
    if (!bVar1) break;
    mode = mode + 1;
    handle = handle + 1;
  }
  for (n = 0; n < local_44; n = n + 1) {
    uVar2 = ndiHexToUnsignedLong((char *)mode,2);
    handle = 0;
    while( true ) {
      bVar1 = false;
      if (handle < 2) {
        bVar1 = '\x1f' < *(char *)mode;
      }
      if (!bVar1) break;
      mode = mode + 1;
      handle = handle + 1;
    }
    if (*(char *)mode == 'U') {
      handle = 0;
      while( true ) {
        bVar1 = false;
        if (handle < 10) {
          bVar1 = '\x1f' < *(char *)mode;
        }
        if (!bVar1) break;
        mode = mode + 1;
        handle = handle + 1;
      }
      n = n + -1;
      local_44 = local_44 + -1;
    }
    else {
      pol->TxHandles[n] = (uchar)uVar2;
      if (((ulong)writePointer & 1) != 0) {
        _j = pol->TxTransforms + n;
        if (*(char *)mode == 'M') {
          handle = 0;
          while( true ) {
            bVar1 = false;
            if (handle < 7) {
              bVar1 = '\x1f' < *(char *)mode;
            }
            if (!bVar1) break;
            (*_j)[0] = *(char *)mode;
            handle = handle + 1;
            _j = (char (*) [52])(*_j + 1);
            mode = mode + 1;
          }
        }
        else if (*(char *)mode == 'D') {
          handle = 0;
          while( true ) {
            bVar1 = false;
            if (handle < 8) {
              bVar1 = '\x1f' < *(char *)mode;
            }
            if (!bVar1) break;
            (*_j)[0] = *(char *)mode;
            handle = handle + 1;
            _j = (char (*) [52])(*_j + 1);
            mode = mode + 1;
          }
        }
        else {
          handle = 0;
          while( true ) {
            bVar1 = false;
            if (handle < 0x33) {
              bVar1 = '\x1f' < *(char *)mode;
            }
            if (!bVar1) break;
            (*_j)[0] = *(char *)mode;
            handle = handle + 1;
            _j = (char (*) [52])(*_j + 1);
            mode = mode + 1;
          }
        }
        (*_j)[0] = '\0';
        handle = 0;
        _j = (char (*) [52])(pol->TxStatus + n);
        while( true ) {
          bVar1 = false;
          if (handle < 8) {
            bVar1 = '\x1f' < *(char *)mode;
          }
          if (!bVar1) break;
          (*(char (*) [8])_j)[0] = *(char *)mode;
          handle = handle + 1;
          _j = (char (*) [52])(*(char (*) [8])_j + 1);
          mode = mode + 1;
        }
        handle = 0;
        _j = (char (*) [52])(pol->TxFrame + n);
        while( true ) {
          bVar1 = false;
          if (handle < 8) {
            bVar1 = '\x1f' < *(char *)mode;
          }
          if (!bVar1) break;
          (*(char (*) [8])_j)[0] = *(char *)mode;
          handle = handle + 1;
          _j = (char (*) [52])(*(char (*) [8])_j + 1);
          mode = mode + 1;
        }
      }
      if (((ulong)writePointer & 2) != 0) {
        handle = 0;
        _j = (char (*) [52])(pol->TxInformation + n);
        while( true ) {
          bVar1 = false;
          if (handle < 0x14) {
            bVar1 = '\x1f' < *(char *)mode;
          }
          if (!bVar1) break;
          (*(char (*) [12])_j)[0] = *(char *)mode;
          handle = handle + 1;
          _j = (char (*) [52])(*(char (*) [12])_j + 1);
          mode = mode + 1;
        }
      }
      if (((ulong)writePointer & 4) != 0) {
        _j = (char (*) [52])(pol->TxSingleStray + n);
        if (*(char *)mode == 'M') {
          handle = 0;
          while( true ) {
            bVar1 = false;
            if (handle < 7) {
              bVar1 = '\x1f' < *(char *)mode;
            }
            if (!bVar1) break;
            (*(char (*) [24])_j)[0] = *(char *)mode;
            handle = handle + 1;
            _j = (char (*) [52])(*(char (*) [24])_j + 1);
            mode = mode + 1;
          }
        }
        else if (*(char *)mode == 'D') {
          handle = 0;
          while( true ) {
            bVar1 = false;
            if (handle < 8) {
              bVar1 = '\x1f' < *(char *)mode;
            }
            if (!bVar1) break;
            (*(char (*) [24])_j)[0] = *(char *)mode;
            handle = handle + 1;
            _j = (char (*) [52])(*(char (*) [24])_j + 1);
            mode = mode + 1;
          }
        }
        else {
          handle = 0;
          while( true ) {
            bVar1 = false;
            if (handle < 0x15) {
              bVar1 = '\x1f' < *(char *)mode;
            }
            if (!bVar1) break;
            (*(char (*) [24])_j)[0] = *(char *)mode;
            handle = handle + 1;
            _j = (char (*) [52])(*(char (*) [24])_j + 1);
            mode = mode + 1;
          }
        }
        (*(char (*) [24])_j)[0] = '\0';
      }
      for (; '\x1f' < *(char *)mode; mode = mode + 1) {
      }
      if (*(char *)mode == '\n') {
        mode = mode + 1;
      }
    }
  }
  pol->TxHandleCount = local_44;
  if (((ulong)writePointer & 0x1000) != 0) {
    uVar2 = ndiHexToUnsignedLong((char *)mode,2);
    local_48 = (int)uVar2;
    handle = 0;
    while( true ) {
      bVar1 = false;
      if (handle < 2) {
        bVar1 = '\x1f' < *(char *)mode;
      }
      if (!bVar1) break;
      mode = mode + 1;
      handle = handle + 1;
    }
    if (0x32 < local_48) {
      local_48 = 0x32;
    }
    pol->TxPassiveStrayCount = local_48;
    handle = 0;
    _j = (char (*) [52])pol->TxPassiveStrayOov;
    while( true ) {
      bVar1 = false;
      if (handle < (local_48 + 3) / 4) {
        bVar1 = '\x1f' < *(char *)mode;
      }
      if (!bVar1) break;
      (*_j)[0] = *(char *)mode;
      handle = handle + 1;
      _j = (char (*) [52])((long)_j + 1);
      mode = mode + 1;
    }
    handle = 0;
    _j = (char (*) [52])pol->TxPassiveStray;
    while( true ) {
      bVar1 = false;
      if (handle < local_48 * 0x15) {
        bVar1 = '\x1f' < *(char *)mode;
      }
      if (!bVar1) break;
      (*_j)[0] = *(char *)mode;
      handle = handle + 1;
      _j = (char (*) [52])((long)_j + 1);
      mode = mode + 1;
    }
    (*_j)[0] = '\0';
  }
  handle = 0;
  _j = (char (*) [52])pol->TxSystemStatus;
  while( true ) {
    bVar1 = false;
    if (handle < 4) {
      bVar1 = '\x1f' < *(char *)mode;
    }
    if (!bVar1) break;
    (*_j)[0] = *(char *)mode;
    handle = handle + 1;
    _j = (char (*) [52])((long)_j + 1);
    mode = mode + 1;
  }
  return;
}

Assistant:

void ndiTXHelper(ndicapi* pol, const char* command, const char* commandReply)
  {
    unsigned long mode = NDI_XFORMS_AND_STATUS; // the default reply mode
    char* writePointer;
    int i, j, n;
    int handle, handleCount, strayCount;

    // if the TX command had a reply mode, read it
    if ((command[2] == ':' && command[7] != '\r') || (command[2] == ' ' && command[3] != '\r'))
    {
      mode = ndiHexToUnsignedLong(&command[3], 4);
    }

    // get the number of handles
    handleCount = (int)ndiHexToUnsignedLong(commandReply, 2);
    for (j = 0; j < 2 && *commandReply >= ' '; j++)
    {
      commandReply++;
    }

    // go through the information for each handle
    for (i = 0; i < handleCount; i++)
    {
      // get the handle itself (two chars)
      handle = (int)ndiHexToUnsignedLong(commandReply, 2);
      for (j = 0; j < 2 && *commandReply >= ' '; j++)
      {
        commandReply++;
      }

      // check for "UNOCCUPIED"
      if (*commandReply == 'U')
      {
        for (j = 0; j < 10 && *commandReply >= ' '; j++)
        {
          commandReply++;
        }
        // back up and continue (don't store information for unoccupied ports)
        i--;
        handleCount--;
        continue;
      }

      // save the port handle in the list
      pol->TxHandles[i] = handle;

      if (mode & NDI_XFORMS_AND_STATUS)
      {
        // get the transform, MISSING, or DISABLED
        writePointer = pol->TxTransforms[i];

        if (*commandReply == 'M')
        {
          // check for "MISSING"
          for (j = 0; j < 7 && *commandReply >= ' '; j++)
          {
            *writePointer++ = *commandReply++;
          }
        }
        else if (*commandReply == 'D')
        {
          // check for "DISABLED"
          for (j = 0; j < 8 && *commandReply >= ' '; j++)
          {
            *writePointer++ = *commandReply++;
          }
        }
        else
        {
          // read the transform
          for (j = 0; j < 51 && *commandReply >= ' '; j++)
          {
            *writePointer++ = *commandReply++;
          }
        }
        *writePointer = '\0';

        // get the status
        writePointer = pol->TxStatus[i];
        for (j = 0; j < 8 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }

        // get the frame number
        writePointer = pol->TxFrame[i];
        for (j = 0; j < 8 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }

      // grab additional information
      if (mode & NDI_ADDITIONAL_INFO)
      {
        writePointer = pol->TxInformation[i];
        for (j = 0; j < 20 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }

      // grab the single marker info
      if (mode & NDI_SINGLE_STRAY)
      {
        writePointer = pol->TxSingleStray[i];
        if (*commandReply == 'M')
        {
          // check for "MISSING"
          for (j = 0; j < 7 && *commandReply >= ' '; j++)
          {
            *writePointer++ = *commandReply++;
          }
        }
        else if (*commandReply == 'D')
        {
          // check for "DISABLED"
          for (j = 0; j < 8 && *commandReply >= ' '; j++)
          {
            *writePointer++ = *commandReply++;
          }
        }
        else
        {
          // read the single stray position
          for (j = 0; j < 21 && *commandReply >= ' '; j++)
          {
            *writePointer++ = *commandReply++;
          }
        }
        *writePointer = '\0';
      }

      // skip over any unsupported information
      while (*commandReply >= ' ')
      {
        commandReply++;
      }

      // eat the trailing newline
      if (*commandReply == '\n')
      {
        commandReply++;
      }
    }

    // save the number of handles (minus the unoccupied handles)
    pol->TxHandleCount = handleCount;

    // get all the passive stray information
    // this will be a maximum of 2 + ceil(numMarkers*0.5) + Y
    // where Y is
    //   0800 not used: 21 * numMarkers inside characterized measurement volume
    //   0800 used: 21 * numMarkers
    if (mode & NDI_PASSIVE_STRAY)
    {
      // get the number of strays
      strayCount = (int)ndiHexToUnsignedLong(commandReply, 2);
      for (j = 0; j < 2 && *commandReply >= ' '; j++)
      {
        commandReply++;
      }
      if (strayCount > 50)
      {
        strayCount = 50;
      }
      pol->TxPassiveStrayCount = strayCount;
      // get the out-of-volume bits
      writePointer = pol->TxPassiveStrayOov;
      n = (strayCount + 3) / 4;
      for (j = 0; j < n && *commandReply >= ' '; j++)
      {
        *writePointer++ = *commandReply++;
      }
      // get the coordinates
      writePointer = pol->TxPassiveStray;
      n = strayCount * 21;
      for (j = 0; j < n && *commandReply >= ' '; j++)
      {
        *writePointer++ = *commandReply++;
      }
      *writePointer = '\0';
    }

    // get the system status
    writePointer = pol->TxSystemStatus;
    for (j = 0; j < 4 && *commandReply >= ' '; j++)
    {
      *writePointer++ = *commandReply++;
    }
  }